

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_buffer.c
# Opt level: O3

_Bool buffer_grow_fragments(buffer_t *buffer,zip_uint64_t capacity,zip_error_t *error)

{
  zip_uint64_t *alloced_elements;
  ulong uVar1;
  _Bool _Var2;
  zip_uint64_t additional_elements;
  zip_uint64_t offset_capacity;
  zip_uint64_t local_30;
  
  uVar1 = buffer->fragments_capacity;
  local_30 = uVar1 + 1;
  _Var2 = true;
  additional_elements = capacity - uVar1;
  if (uVar1 <= capacity && additional_elements != 0) {
    alloced_elements = &buffer->fragments_capacity;
    _Var2 = zip_realloc(&buffer->fragments,alloced_elements,0x10,additional_elements,error);
    if (_Var2) {
      _Var2 = zip_realloc(&buffer->fragment_offsets,&local_30,8,additional_elements,error);
      if (_Var2) {
        return true;
      }
      *alloced_elements = *alloced_elements - additional_elements;
    }
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

static bool
buffer_grow_fragments(buffer_t *buffer, zip_uint64_t capacity, zip_error_t *error) {
    zip_uint64_t additional_fragments;
    zip_uint64_t offset_capacity = buffer->fragments_capacity + 1;

    if (capacity <= buffer->fragments_capacity) {
        return true;
    }

    additional_fragments = capacity - buffer->fragments_capacity;

    if (!ZIP_REALLOC(buffer->fragments, buffer->fragments_capacity, additional_fragments, error)) {
        return false;
    }
    /* The size of both buffer->fragments and buffer->fragment_offsets is stored in buffer->fragments_capacity, so use a temporary capacity variable here for reallocating buffer->fragment_offsets. */
    if (!ZIP_REALLOC(buffer->fragment_offsets, offset_capacity, additional_fragments, error)) {
        buffer->fragments_capacity -= additional_fragments;
        return false;
    }

    return true;
}